

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitCompoundStatement(SyntaxDumper *this,CompoundStatementSyntax *node)

{
  CompoundStatementSyntax local_a0 [56];
  StatementListSyntax *local_68;
  StatementListSyntax *iter;
  CompoundStatementSyntax local_50 [56];
  CompoundStatementSyntax *local_18;
  CompoundStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (CompoundStatementSyntax *)this;
  CompoundStatementSyntax::openBraceToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  for (local_68 = CompoundStatementSyntax::statements(local_18);
      local_68 != (StatementListSyntax *)0x0; local_68 = *(StatementListSyntax **)(local_68 + 0x10))
  {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_68 + 8));
  }
  CompoundStatementSyntax::closeBraceToken(local_a0);
  (**(code **)(*(long *)this + 0x2e8))(this,local_a0,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_a0);
  return Skip;
}

Assistant:

virtual Action visitCompoundStatement(const CompoundStatementSyntax* node) override
    {
        terminal(node->openBraceToken(), node);
        for (auto iter = node->statements(); iter; iter = iter->next)
            nonterminal(iter->value);
        terminal(node->closeBraceToken(), node);
        return Action::Skip;
    }